

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::ColumnReader::CreateReader
          (ColumnReader *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  ParquetExtraTypeInfo PVar1;
  NotImplementedException *pNVar2;
  InternalException *pIVar3;
  allocator local_41;
  string local_40;
  
  switch((schema->type).id_) {
  case SQLNULL:
    make_uniq<duckdb::NullColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  default:
    pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    LogicalType::ToString_abi_cxx11_(&local_40,&schema->type);
    NotImplementedException::NotImplementedException(pNVar2,&local_40);
    __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    make_uniq<duckdb::BooleanColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case TINYINT:
    make_uniq<duckdb::TemplatedColumnReader<signed_char,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case SMALLINT:
    make_uniq<duckdb::TemplatedColumnReader<short,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case INTEGER:
    make_uniq<duckdb::TemplatedColumnReader<int,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case BIGINT:
    make_uniq<duckdb::TemplatedColumnReader<long,duckdb::TemplatedParquetValueConversion<long>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case DATE:
    make_uniq<duckdb::CallbackColumnReader<int,duckdb::date_t,&duckdb::ParquetIntToDate>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case TIME:
    PVar1 = schema->type_info;
    if (PVar1 == UNIT_NS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTimeNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    else if (PVar1 == UNIT_MICROS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_t,&duckdb::ParquetIntToTime>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    else {
      if (PVar1 != UNIT_MS) {
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_40,"TIME requires type info",&local_41);
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      make_uniq<duckdb::CallbackColumnReader<int,duckdb::dtime_t,&duckdb::ParquetIntToTimeMs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    break;
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    switch(schema->type_info) {
    case IMPALA_TIMESTAMP:
      make_uniq<duckdb::CallbackColumnReader<duckdb::Int96,duckdb::timestamp_t,&duckdb::ImpalaTimestampToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    case UNIT_NS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampNsToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    case UNIT_MS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMsToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    case UNIT_MICROS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_t,&duckdb::ParquetTimestampMicrosToTimestamp>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    default:
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_40,"TIMESTAMP requires type info",&local_41);
      InternalException::InternalException(pIVar3,&local_40);
      __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case TIMESTAMP_NS:
    switch(schema->type_info) {
    case IMPALA_TIMESTAMP:
      make_uniq<duckdb::CallbackColumnReader<duckdb::Int96,duckdb::timestamp_ns_t,&duckdb::ImpalaTimestampToTimestampNS>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    case UNIT_NS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampNsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    case UNIT_MS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampMsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    case UNIT_MICROS:
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::timestamp_ns_t,&duckdb::ParquetTimestampUsToTimestampNs>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
      break;
    default:
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"TIMESTAMP_NS requires type info",&local_41);
      InternalException::InternalException(pIVar3,&local_40);
      __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case DECIMAL:
    PVar1 = schema->type_info;
    if (PVar1 != DECIMAL_BYTE_ARRAY) {
      if (PVar1 == DECIMAL_INT64) {
        CreateDecimalReader<long>((duckdb *)this,reader,schema);
        return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
               (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
      }
      if (PVar1 == DECIMAL_INT32) {
        CreateDecimalReader<int>((duckdb *)this,reader,schema);
        return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
               (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
      }
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Unrecognized Parquet type for Decimal",&local_41);
      NotImplementedException::NotImplementedException(pNVar2,&local_40);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_01dee3f2:
    ParquetDecimalUtils::CreateReader((ParquetDecimalUtils *)this,reader,schema);
    return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
           (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
  case FLOAT:
    if (schema->type_info == FLOAT16) {
      make_uniq<duckdb::CallbackColumnReader<unsigned_short,float,&duckdb::Float16ToFloat32>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    else {
      make_uniq<duckdb::TemplatedColumnReader<float,duckdb::TemplatedParquetValueConversion<float>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    break;
  case DOUBLE:
    if (schema->type_info == DECIMAL_BYTE_ARRAY) goto LAB_01dee3f2;
    make_uniq<duckdb::TemplatedColumnReader<double,duckdb::TemplatedParquetValueConversion<double>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case VARCHAR:
  case BLOB:
    make_uniq<duckdb::StringColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case INTERVAL:
    make_uniq<duckdb::IntervalColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case UTINYINT:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_char,duckdb::TemplatedParquetValueConversion<unsigned_int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case USMALLINT:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_short,duckdb::TemplatedParquetValueConversion<unsigned_int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case UINTEGER:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_int,duckdb::TemplatedParquetValueConversion<unsigned_int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case UBIGINT:
    make_uniq<duckdb::TemplatedColumnReader<unsigned_long,duckdb::TemplatedParquetValueConversion<unsigned_long>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
    break;
  case TIME_TZ:
    PVar1 = schema->type_info;
    if (PVar1 == UNIT_NS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeNsTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    else if (PVar1 == UNIT_MICROS) {
      make_uniq<duckdb::CallbackColumnReader<long,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    else {
      if (PVar1 != UNIT_MS) {
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_40,"TIME_TZ requires type info",&local_41);
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      make_uniq<duckdb::CallbackColumnReader<int,duckdb::dtime_tz_t,&duckdb::ParquetIntToTimeMsTZ>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
                ((duckdb *)&local_40,reader,schema);
    }
    break;
  case UUID:
    make_uniq<duckdb::UUIDColumnReader,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_40,reader,schema);
  }
  this->_vptr_ColumnReader = (_func_int **)local_40._M_dataplus._M_p;
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> ColumnReader::CreateReader(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<BooleanColumnReader>(reader, schema);
	case LogicalTypeId::UTINYINT:
		return make_uniq<TemplatedColumnReader<uint8_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::USMALLINT:
		return make_uniq<TemplatedColumnReader<uint16_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::UINTEGER:
		return make_uniq<TemplatedColumnReader<uint32_t, TemplatedParquetValueConversion<uint32_t>>>(reader, schema);
	case LogicalTypeId::UBIGINT:
		return make_uniq<TemplatedColumnReader<uint64_t, TemplatedParquetValueConversion<uint64_t>>>(reader, schema);
	case LogicalTypeId::TINYINT:
		return make_uniq<TemplatedColumnReader<int8_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::SMALLINT:
		return make_uniq<TemplatedColumnReader<int16_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::INTEGER:
		return make_uniq<TemplatedColumnReader<int32_t, TemplatedParquetValueConversion<int32_t>>>(reader, schema);
	case LogicalTypeId::BIGINT:
		return make_uniq<TemplatedColumnReader<int64_t, TemplatedParquetValueConversion<int64_t>>>(reader, schema);
	case LogicalTypeId::FLOAT:
		if (schema.type_info == ParquetExtraTypeInfo::FLOAT16) {
			return make_uniq<CallbackColumnReader<uint16_t, float, Float16ToFloat32>>(reader, schema);
		}
		return make_uniq<TemplatedColumnReader<float, TemplatedParquetValueConversion<float>>>(reader, schema);
	case LogicalTypeId::DOUBLE:
		if (schema.type_info == ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY) {
			return ParquetDecimalUtils::CreateReader(reader, schema);
		}
		return make_uniq<TemplatedColumnReader<double, TemplatedParquetValueConversion<double>>>(reader, schema);
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::IMPALA_TIMESTAMP:
			return make_uniq<CallbackColumnReader<Int96, timestamp_t, ImpalaTimestampToTimestamp>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampMsToTimestamp>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampMicrosToTimestamp>>(reader,
			                                                                                                schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_t, ParquetTimestampNsToTimestamp>>(reader, schema);
		default:
			throw InternalException("TIMESTAMP requires type info");
		}
	case LogicalTypeId::TIMESTAMP_NS:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::IMPALA_TIMESTAMP:
			return make_uniq<CallbackColumnReader<Int96, timestamp_ns_t, ImpalaTimestampToTimestampNS>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampMsToTimestampNs>>(reader,
			                                                                                                 schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampUsToTimestampNs>>(reader,
			                                                                                                 schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, timestamp_ns_t, ParquetTimestampNsToTimestampNs>>(reader,
			                                                                                                 schema);
		default:
			throw InternalException("TIMESTAMP_NS requires type info");
		}
	case LogicalTypeId::DATE:
		return make_uniq<CallbackColumnReader<int32_t, date_t, ParquetIntToDate>>(reader, schema);
	case LogicalTypeId::TIME:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int32_t, dtime_t, ParquetIntToTimeMs>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_t, ParquetIntToTime>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_t, ParquetIntToTimeNs>>(reader, schema);
		default:
			throw InternalException("TIME requires type info");
		}
	case LogicalTypeId::TIME_TZ:
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return make_uniq<CallbackColumnReader<int32_t, dtime_tz_t, ParquetIntToTimeMsTZ>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_MICROS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_tz_t, ParquetIntToTimeTZ>>(reader, schema);
		case ParquetExtraTypeInfo::UNIT_NS:
			return make_uniq<CallbackColumnReader<int64_t, dtime_tz_t, ParquetIntToTimeNsTZ>>(reader, schema);
		default:
			throw InternalException("TIME_TZ requires type info");
		}
	case LogicalTypeId::BLOB:
	case LogicalTypeId::VARCHAR:
		return make_uniq<StringColumnReader>(reader, schema);
	case LogicalTypeId::DECIMAL:
		// we have to figure out what kind of int we need
		switch (schema.type_info) {
		case ParquetExtraTypeInfo::DECIMAL_INT32:
			return CreateDecimalReader<int32_t>(reader, schema);
		case ParquetExtraTypeInfo::DECIMAL_INT64:
			return CreateDecimalReader<int64_t>(reader, schema);
		case ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY:
			return ParquetDecimalUtils::CreateReader(reader, schema);
		default:
			throw NotImplementedException("Unrecognized Parquet type for Decimal");
		}
		break;
	case LogicalTypeId::UUID:
		return make_uniq<UUIDColumnReader>(reader, schema);
	case LogicalTypeId::INTERVAL:
		return make_uniq<IntervalColumnReader>(reader, schema);
	case LogicalTypeId::SQLNULL:
		return make_uniq<NullColumnReader>(reader, schema);
	default:
		break;
	}
	throw NotImplementedException(schema.type.ToString());
}